

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O0

void __thiscall Rml::StyleSheetFactory::StyleSheetFactory(StyleSheetFactory *this)

{
  initializer_list<robin_hood::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>_>
  initlist;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
  *local_290;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_276;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_275;
  StructuralSelectorType local_274 [16];
  StructuralSelectorType local_234;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
  *local_230;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
  local_228;
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_200 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_1d8 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_1b0 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_188 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_160 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_138 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_110 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_e8 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_c0 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_98 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_70 [40];
  pair<std::__cxx11::string,Rml::StructuralSelectorType> local_48 [40];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  StyleSheetFactory *this_local;
  
  local_10 = (undefined1  [8])this;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(&this->stylesheets);
  local_230 = &local_228;
  local_234 = Nth_Child;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[10],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [10])"nth-child",&local_234);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_200;
  local_274[0xb] = 2;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[15],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [15])"nth-last-child",local_274 + 0xb);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_1d8;
  local_274[10] = 3;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[12],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [12])"nth-of-type",local_274 + 10);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_1b0;
  local_274[9] = 4;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[17],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [17])"nth-last-of-type",local_274 + 9);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_188;
  local_274[8] = 5;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[12],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [12])"first-child",local_274 + 8);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_160;
  local_274[7] = 6;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[11],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [11])0x7156d0,local_274 + 7);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_138;
  local_274[6] = 7;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[14],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [14])"first-of-type",local_274 + 6);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_110;
  local_274[5] = 8;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[13],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [13])0x7156eb,local_274 + 5);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_e8;
  local_274[4] = 9;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[11],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [11])"only-child",local_274 + 4);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_c0;
  local_274[3] = 10;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[13],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [13])"only-of-type",local_274 + 3);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_98;
  local_274[2] = 0xb;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[6],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [6])"empty",local_274 + 2);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_70;
  local_274[1] = 0xc;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[4],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [4])0x70fd10,local_274 + 1);
  local_230 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)local_48;
  local_274[0] = Scope;
  robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>::
  pair<char_const(&)[6],Rml::StructuralSelectorType>
            ((pair<std::__cxx11::string,Rml::StructuralSelectorType> *)local_230,
             (char (*) [6])"scope",local_274);
  local_20 = &local_228;
  local_18 = 0xd;
  initlist._M_len = 0xd;
  initlist._M_array = local_20;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(&this->selectors,initlist,0,&local_275,&local_276);
  local_290 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
               *)&local_20;
  do {
    local_290 = local_290 + -1;
    robin_hood::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
    ::~pair(local_290);
  } while (local_290 != &local_228);
  return;
}

Assistant:

StyleSheetFactory::StyleSheetFactory() :
	selectors{
		{"nth-child", StructuralSelectorType::Nth_Child},
		{"nth-last-child", StructuralSelectorType::Nth_Last_Child},
		{"nth-of-type", StructuralSelectorType::Nth_Of_Type},
		{"nth-last-of-type", StructuralSelectorType::Nth_Last_Of_Type},
		{"first-child", StructuralSelectorType::First_Child},
		{"last-child", StructuralSelectorType::Last_Child},
		{"first-of-type", StructuralSelectorType::First_Of_Type},
		{"last-of-type", StructuralSelectorType::Last_Of_Type},
		{"only-child", StructuralSelectorType::Only_Child},
		{"only-of-type", StructuralSelectorType::Only_Of_Type},
		{"empty", StructuralSelectorType::Empty},
		{"not", StructuralSelectorType::Not},
		{"scope", StructuralSelectorType::Scope},
	}
{}